

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

unsigned_long xmlDictComputeFastQKey(xmlChar *prefix,int plen,xmlChar *name,int len,int seed)

{
  int local_34;
  unsigned_long uStack_30;
  int offset;
  unsigned_long value;
  int seed_local;
  int len_local;
  xmlChar *name_local;
  int plen_local;
  xmlChar *prefix_local;
  
  if (plen == 0) {
    uStack_30 = (long)seed + 0x6cc;
  }
  else {
    uStack_30 = (long)(int)((uint)*prefix * 0x1e) + (long)seed;
  }
  value._4_4_ = len;
  name_local._4_4_ = plen;
  if (10 < len) {
    local_34 = len - (plen + 2);
    if (local_34 < 0) {
      local_34 = len + -0xb;
    }
    uStack_30 = name[local_34] + uStack_30;
    value._4_4_ = 10;
    if (10 < plen) {
      name_local._4_4_ = 10;
    }
  }
  switch(name_local._4_4_) {
  case 10:
    uStack_30 = prefix[9] + uStack_30;
  case 9:
    uStack_30 = prefix[8] + uStack_30;
  case 8:
    uStack_30 = prefix[7] + uStack_30;
  case 7:
    uStack_30 = prefix[6] + uStack_30;
  case 6:
    uStack_30 = prefix[5] + uStack_30;
  case 5:
    uStack_30 = prefix[4] + uStack_30;
  case 4:
    uStack_30 = prefix[3] + uStack_30;
  case 3:
    uStack_30 = prefix[2] + uStack_30;
  case 2:
    uStack_30 = prefix[1] + uStack_30;
  case 1:
    uStack_30 = *prefix + uStack_30;
  default:
    value._4_4_ = value._4_4_ - name_local._4_4_;
    if (0 < value._4_4_) {
      uStack_30 = uStack_30 + 0x3a;
      value._4_4_ = value._4_4_ + -1;
    }
  }
  switch(value._4_4_) {
  case 10:
    uStack_30 = name[9] + uStack_30;
  case 9:
    uStack_30 = name[8] + uStack_30;
  case 8:
    uStack_30 = name[7] + uStack_30;
  case 7:
    uStack_30 = name[6] + uStack_30;
  case 6:
    uStack_30 = name[5] + uStack_30;
  case 5:
    uStack_30 = name[4] + uStack_30;
  case 4:
    uStack_30 = name[3] + uStack_30;
  case 3:
    uStack_30 = name[2] + uStack_30;
  case 2:
    uStack_30 = name[1] + uStack_30;
  case 1:
    return *name + uStack_30;
  default:
    return uStack_30;
  }
}

Assistant:

static unsigned long
xmlDictComputeFastQKey(const xmlChar *prefix, int plen,
                       const xmlChar *name, int len, int seed)
{
    unsigned long value = (unsigned long) seed;

    if (plen == 0)
	value += 30 * (unsigned long) ':';
    else
	value += 30 * (*prefix);

    if (len > 10) {
        int offset = len - (plen + 1 + 1);
	if (offset < 0)
	    offset = len - (10 + 1);
	value += name[offset];
        len = 10;
	if (plen > 10)
	    plen = 10;
    }
    switch (plen) {
        case 10: value += prefix[9];
        /* Falls through. */
        case 9: value += prefix[8];
        /* Falls through. */
        case 8: value += prefix[7];
        /* Falls through. */
        case 7: value += prefix[6];
        /* Falls through. */
        case 6: value += prefix[5];
        /* Falls through. */
        case 5: value += prefix[4];
        /* Falls through. */
        case 4: value += prefix[3];
        /* Falls through. */
        case 3: value += prefix[2];
        /* Falls through. */
        case 2: value += prefix[1];
        /* Falls through. */
        case 1: value += prefix[0];
        /* Falls through. */
        default: break;
    }
    len -= plen;
    if (len > 0) {
        value += (unsigned long) ':';
	len--;
    }
    switch (len) {
        case 10: value += name[9];
        /* Falls through. */
        case 9: value += name[8];
        /* Falls through. */
        case 8: value += name[7];
        /* Falls through. */
        case 7: value += name[6];
        /* Falls through. */
        case 6: value += name[5];
        /* Falls through. */
        case 5: value += name[4];
        /* Falls through. */
        case 4: value += name[3];
        /* Falls through. */
        case 3: value += name[2];
        /* Falls through. */
        case 2: value += name[1];
        /* Falls through. */
        case 1: value += name[0];
        /* Falls through. */
        default: break;
    }
    return(value);
}